

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void print_states(Grammar *g)

{
  uint local_14;
  uint i;
  Grammar *g_local;
  
  for (local_14 = 0; local_14 < (g->states).n; local_14 = local_14 + 1) {
    print_state((g->states).v[local_14]);
  }
  return;
}

Assistant:

void print_states(Grammar *g) {
  uint i;

  for (i = 0; i < g->states.n; i++) print_state(g->states.v[i]);
}